

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

bool jsonip::parser::
     or_<jsonip::parser::seq_<jsonip::parser::char_<(char)92>,jsonip::parser::anychar_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>,jsonip::parser::notchar_<(char)34>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>,jsonip::parser::identity<false>>
     ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::Reader> *state)

{
  bool bVar1;
  
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::push_state(state);
  bVar1 = seq_<jsonip::parser::char_<(char)92>,jsonip::parser::anychar_,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>,jsonip::parser::identity<true>>
          ::match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>(state)
  ;
  if ((!bVar1) &&
     (bVar1 = notchar_<(char)34>::
              match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::Reader>>
                        (state), !bVar1)) {
    ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::rollback(state);
    return false;
  }
  ReaderState<jsonip::semantic_state,_jsonip::parser::Reader>::commit(state);
  return true;
}

Assistant:

static inline bool match(S& state)
        {
            state.push_state();

            bool var = C0::match(state) || C1::match(state) ||
                       C2::match(state) || C3::match(state) ||
                       C4::match(state) || C5::match(state) ||
                       C6::match(state) || C7::match(state);

            var ? state.commit() : state.rollback();

            return var;
        }